

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O2

char * hex_string(uchar *str,size_t len)

{
  char *pcVar1;
  char *__s;
  size_t sVar2;
  
  pcVar1 = (char *)malloc(len * 2 + 1);
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
    for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
      snprintf(__s,2,"%02x",(ulong)str[sVar2]);
      __s = __s + 2;
    }
    pcVar1[len * 2] = '\0';
  }
  return pcVar1;
}

Assistant:

static char *hex_string(unsigned char *str, size_t len)
{
	// returns a malloced string that has the hex version of the string in it
	// null if failed to malloc
	char *hex_out;
	size_t i;

	hex_out = (char *) malloc(len*2 + 1); // two ascii characters per input character, plus trailing null
	if (!hex_out) { goto Exit; }

	for (i = 0; i < len; ++i) {
		snprintf(hex_out + (i*2), 2, "%02x", str[i]);
	}

	hex_out[len*2] = 0; // trailing null

Exit:
	return hex_out;
}